

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::getPartStates(Synth *this,bool *partStates)

{
  uint uVar1;
  Part *part;
  int partNumber;
  bool *partStates_local;
  Synth *this_local;
  
  if ((this->opened & 1U) == 0) {
    memset(partStates,0,9);
  }
  else {
    for (part._4_4_ = 0; part._4_4_ < 9; part._4_4_ = part._4_4_ + 1) {
      uVar1 = Part::getActiveNonReleasingPartialCount(this->parts[part._4_4_]);
      partStates[part._4_4_] = uVar1 != 0;
    }
  }
  return;
}

Assistant:

void Synth::getPartStates(bool *partStates) const {
	if (!opened) {
		memset(partStates, 0, 9 * sizeof(bool));
		return;
	}
	for (int partNumber = 0; partNumber < 9; partNumber++) {
		const Part *part = parts[partNumber];
		partStates[partNumber] = part->getActiveNonReleasingPartialCount() > 0;
	}
}